

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatAdapters.h
# Opt level: O0

void __thiscall llvm::detail::ErrorAdapter::~ErrorAdapter(ErrorAdapter *this)

{
  Error local_18;
  ErrorAdapter *local_10;
  ErrorAdapter *this_local;
  
  (this->super_FormatAdapter<llvm::Error>).super_format_adapter._vptr_format_adapter =
       (_func_int **)&PTR_anchor_0271d7c0;
  local_10 = this;
  Error::Error(&local_18,&(this->super_FormatAdapter<llvm::Error>).Item);
  consumeError(&local_18);
  Error::~Error(&local_18);
  FormatAdapter<llvm::Error>::~FormatAdapter(&this->super_FormatAdapter<llvm::Error>);
  return;
}

Assistant:

~ErrorAdapter() { consumeError(std::move(Item)); }